

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::image_type_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  SPIRType *pSVar5;
  long *plVar6;
  runtime_error *prVar7;
  size_type *psVar8;
  string res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  _Alloc_hider local_1a0;
  size_type local_198;
  char local_190;
  undefined7 uStack_18f;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  uint *local_160;
  size_t local_158;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      (type->image).type.id);
  local_198 = 0;
  local_190 = '\0';
  uVar4 = *(int *)&(pSVar5->super_IVariant).field_0xc - 3;
  local_1a0._M_p = &local_190;
  if (uVar4 < 6) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_1a0,0,(char *)0x0,
               (ulong)(&DAT_003401f4 + *(int *)(&DAT_003401f4 + (ulong)uVar4 * 4)));
  }
  bVar3 = (type->image).dim == DimSubpassData;
  bVar2 = *(int *)&(type->super_IVariant).field_0xc == 0x10;
  if (bVar3 && bVar2) {
    if ((this->options).vulkan_semantics == true) {
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_180,local_1a0._M_p,local_1a0._M_p + local_198);
      ::std::__cxx11::string::append(local_180);
      plVar6 = (long *)::std::__cxx11::string::append(local_180);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar8) {
        lVar1 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
      goto LAB_00211360;
    }
    if ((bVar3 && bVar2) && (bVar3 = subpass_input_is_framebuffer_fetch(this,id), bVar3)) {
      pSVar5 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (type->image).type.id);
      SPIRType::SPIRType((SPIRType *)local_180,pSVar5);
      local_180._20_4_ = 4;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,local_180,0);
      local_180._0_8_ = &PTR__SPIRType_003d8230;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
      local_b8 = 0;
      if (local_c0 != local_a8) {
        free(local_c0);
      }
      local_f0 = 0;
      if (local_f8 != local_e0) {
        free(local_f8);
      }
      local_120 = 0;
      if (local_128 != local_110) {
        free(local_128);
      }
      local_158 = 0;
      if (local_160 != local_148) {
        free(local_160);
      }
      goto LAB_00211360;
    }
  }
  ::std::__cxx11::string::append((char *)&local_1a0);
  switch((type->image).dim) {
  case Dim1D:
    break;
  case Dim2D:
  case DimSubpassData:
    break;
  case Dim3D:
    break;
  case DimCube:
    break;
  case DimRect:
    if ((this->options).es == true) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"Rectangle textures are not supported on OpenGL ES.","");
      ::std::runtime_error::runtime_error(prVar7,(string *)local_180);
      *(undefined ***)prVar7 = &PTR__runtime_error_003d7e38;
      __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->options).version < 0x82) {
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"GL_ARB_texture_rectangle","");
      require_extension_internal(this,(string *)local_180);
LAB_00211243:
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
    }
    break;
  case DimBuffer:
    bVar3 = (this->options).es;
    uVar4 = (this->options).version;
    if ((uVar4 < 0x140 & bVar3) == 1) {
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"GL_EXT_texture_buffer","");
      require_extension_internal(this,(string *)local_180);
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
    }
    else if (bVar3 == false && uVar4 < 300) {
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"GL_EXT_texture_buffer_object","");
      require_extension_internal(this,(string *)local_180);
      goto LAB_00211243;
    }
    break;
  default:
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_180._0_8_ = local_180 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_180,
               "Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.","");
    ::std::runtime_error::runtime_error(prVar7,(string *)local_180);
    *(undefined ***)prVar7 = &PTR__runtime_error_003d7e38;
    __cxa_throw(prVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::append((char *)&local_1a0);
  if ((type->image).ms == true) {
    ::std::__cxx11::string::append((char *)&local_1a0);
  }
  if ((type->image).arrayed == true) {
    if (((this->options).es == false) && ((this->options).version < 0x82)) {
      local_180._0_8_ = local_180 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"GL_EXT_texture_array","");
      require_extension_internal(this,(string *)local_180);
      if ((undefined1 *)local_180._0_8_ != local_180 + 0x10) {
        operator_delete((void *)local_180._0_8_);
      }
    }
    ::std::__cxx11::string::append((char *)&local_1a0);
  }
  if ((*(int *)&(type->super_IVariant).field_0xc - 0x11U < 2) &&
     (bVar3 = Compiler::is_depth_image(&this->super_Compiler,type,id), bVar3)) {
    ::std::__cxx11::string::append((char *)&local_1a0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1a0._M_p == &local_190) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_18f,local_190);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_188;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1a0._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_18f,local_190);
  }
  __return_storage_ptr__->_M_string_length = local_198;
  local_198 = 0;
  local_190 = '\0';
  local_1a0._M_p = &local_190;
LAB_00211360:
  if (local_1a0._M_p != &local_190) {
    operator_delete(local_1a0._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::image_type_glsl(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
	case SPIRType::Short:
	case SPIRType::SByte:
		res = "i";
		break;
	case SPIRType::UInt:
	case SPIRType::UShort:
	case SPIRType::UByte:
		res = "u";
		break;
	default:
		break;
	}

	// For half image types, we will force mediump for the sampler, and cast to f16 after any sampling operation.
	// We cannot express a true half texture type in GLSL. Neither for short integer formats for that matter.

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData && options.vulkan_semantics)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");
	else if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
	         subpass_input_is_framebuffer_fetch(id))
	{
		SPIRType sampled_type = get<SPIRType>(type.image.type);
		sampled_type.vecsize = 4;
		return type_to_glsl(sampled_type);
	}

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		// ES doesn't support 1D. Fake it with 2D.
		res += options.es ? "2D" : "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "Cube";
		break;
	case DimRect:
		if (options.es)
			SPIRV_CROSS_THROW("Rectangle textures are not supported on OpenGL ES.");

		if (is_legacy_desktop())
			require_extension_internal("GL_ARB_texture_rectangle");

		res += "2DRect";
		break;

	case DimBuffer:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_texture_buffer");
		else if (!options.es && options.version < 300)
			require_extension_internal("GL_EXT_texture_buffer_object");
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
	{
		if (is_legacy_desktop())
			require_extension_internal("GL_EXT_texture_array");
		res += "Array";
	}

	// "Shadow" state in GLSL only exists for samplers and combined image samplers.
	if (((type.basetype == SPIRType::SampledImage) || (type.basetype == SPIRType::Sampler)) &&
	    is_depth_image(type, id))
	{
		res += "Shadow";
	}

	return res;
}